

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O0

VmConstant * EvaluateOperand(InstructionVMEvalContext *ctx,VmValue *value)

{
  StackFrame *this;
  StackFrame **ppSVar1;
  VmInstruction *pVVar2;
  VmBlock *block_00;
  VmFunction *function_00;
  VmFunction *function;
  VmBlock *block;
  VmInstruction *instruction;
  VmConstant *constant;
  StackFrame *frame;
  VmValue *value_local;
  InstructionVMEvalContext *ctx_local;
  
  ppSVar1 = SmallArray<InstructionVMEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames);
  this = *ppSVar1;
  ctx_local = (InstructionVMEvalContext *)getType<VmConstant>(value);
  if (ctx_local == (InstructionVMEvalContext *)0x0) {
    pVVar2 = getType<VmInstruction>(value);
    if (pVVar2 == (VmInstruction *)0x0) {
      block_00 = getType<VmBlock>(value);
      if (block_00 == (VmBlock *)0x0) {
        function_00 = getType<VmFunction>(value);
        if (function_00 == (VmFunction *)0x0) {
          __assert_fail("!\"unknown type\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                        ,0x1d3,"VmConstant *EvaluateOperand(InstructionVMEvalContext &, VmValue *)")
          ;
        }
        ctx_local = (InstructionVMEvalContext *)
                    CreateConstantFunction
                              (ctx->allocator,(function_00->super_VmValue).source,function_00);
      }
      else {
        ctx_local = (InstructionVMEvalContext *)
                    CreateConstantBlock(ctx->allocator,(block_00->super_VmValue).source,block_00);
      }
    }
    else {
      ctx_local = (InstructionVMEvalContext *)
                  InstructionVMEvalContext::StackFrame::ReadRegister(this,pVVar2->uniqueId);
    }
  }
  return (VmConstant *)ctx_local;
}

Assistant:

VmConstant* EvaluateOperand(InstructionVMEvalContext &ctx, VmValue *value)
{
	InstructionVMEvalContext::StackFrame *frame = ctx.stackFrames.back();

	if(VmConstant *constant = getType<VmConstant>(value))
		return constant;

	if(VmInstruction *instruction = getType<VmInstruction>(value))
		return frame->ReadRegister(instruction->uniqueId);

	if(VmBlock *block = getType<VmBlock>(value))
		return CreateConstantBlock(ctx.allocator, block->source, block);

	if(VmFunction *function = getType<VmFunction>(value))
		return CreateConstantFunction(ctx.allocator, function->source, function);

	assert(!"unknown type");

	return NULL;
}